

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChPlasticityCosserat::ComputeStiffnessMatrixElastoplastic
          (ChPlasticityCosserat *this,ChMatrixNM<double,_6,_6> *K,ChVector<double> *strain_n,
          ChVector<double> *strain_m,ChBeamMaterialInternalData *data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  double *pdVar10;
  int i;
  long lVar11;
  long lVar12;
  bool bVar13;
  double invepsi;
  ChVector<double> v;
  ChVector<double> *local_1e0 [2];
  ChPlasticityCosserat *local_1d0;
  ChVector<double> bstress_m;
  ChVector<double> bstress_n;
  ChVector<double> astress_m;
  ChVector<double> astress_n;
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  b_plastic_data;
  ChVector<double> me_strain_m_new;
  ChVector<double> me_strain_n_new;
  ChVector<double> local_e8;
  ChVector<double> local_c8;
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  a_plastic_data;
  Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false> local_90;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_58;
  
  astress_n.m_data[2] = 0.0;
  astress_m.m_data[2] = 0.0;
  me_strain_n_new.m_data[2] = 0.0;
  me_strain_m_new.m_data[2] = 0.0;
  astress_n.m_data[0] = 0.0;
  astress_n.m_data[1] = 0.0;
  astress_m.m_data[0] = 0.0;
  astress_m.m_data[1] = 0.0;
  me_strain_n_new.m_data[0] = 0.0;
  me_strain_n_new.m_data[1] = 0.0;
  me_strain_m_new.m_data[0] = 0.0;
  me_strain_m_new.m_data[1] = 0.0;
  a_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  a_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_ChPlasticityCosserat[4])(this,1);
  b_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  b_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  b_plastic_data.
  super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_ChPlasticityCosserat[4])(this,1);
  iVar9 = (*this->_vptr_ChPlasticityCosserat[2])
                    (this,&astress_n,&astress_m,&me_strain_n_new,&me_strain_m_new,
                     ((a_plastic_data.
                       super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                     .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>.
                     _M_head_impl,strain_n,strain_m,data);
  if ((char)iVar9 == '\0') {
    std::__shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2> *)
               &local_90,
               &(this->section->elasticity).
                super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>);
    (*(*(_func_int ***)
        local_90.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data)
      [3])(local_90.
           super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.
           m_data,K,strain_n,strain_m);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_90.
                super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.
                m_rows);
  }
  else {
    invepsi = 1000000.0;
    bstress_n.m_data[0] = 0.0;
    bstress_n.m_data[1] = 0.0;
    bstress_n.m_data[2] = 0.0;
    bstress_m.m_data[0] = 0.0;
    bstress_m.m_data[1] = 0.0;
    bstress_m.m_data[2] = 0.0;
    local_c8.m_data[0] = strain_n->m_data[0];
    local_c8.m_data[1] = strain_n->m_data[1];
    local_c8.m_data[2] = strain_n->m_data[2];
    local_e8.m_data[0] = strain_m->m_data[0];
    local_e8.m_data[1] = strain_m->m_data[1];
    local_e8.m_data[2] = strain_m->m_data[2];
    local_1d0 = this;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      pdVar10 = ChVector<double>::operator[](&local_c8,(uint)lVar11);
      *pdVar10 = *pdVar10 + 1e-06;
      (*local_1d0->_vptr_ChPlasticityCosserat[2])
                (local_1d0,&bstress_n,&bstress_m,&me_strain_n_new,&me_strain_m_new,
                 ((b_plastic_data.
                   super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                 .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>.
                 _M_head_impl,&local_c8,&local_e8,data);
      auVar3._8_8_ = bstress_n.m_data[1];
      auVar3._0_8_ = bstress_n.m_data[0];
      local_1e0[0] = &v;
      auVar7._8_8_ = astress_n.m_data[1];
      auVar7._0_8_ = astress_n.m_data[0];
      v.m_data._0_16_ = vsubpd_avx(auVar3,auVar7);
      v.m_data[2] = bstress_n.m_data[2] - astress_n.m_data[2];
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator*
                (&local_58,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
                 local_1e0,&invepsi);
      Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
                (&local_90,K,0,lVar11,3,1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_90,&local_58);
      auVar1._8_8_ = bstress_m.m_data[1];
      auVar1._0_8_ = bstress_m.m_data[0];
      local_1e0[0] = &v;
      auVar5._8_8_ = astress_m.m_data[1];
      auVar5._0_8_ = astress_m.m_data[0];
      v.m_data._0_16_ = vsubpd_avx(auVar1,auVar5);
      v.m_data[2] = bstress_m.m_data[2] - astress_m.m_data[2];
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator*
                (&local_58,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
                 local_1e0,&invepsi);
      Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
                (&local_90,K,3,lVar11,3,1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_90,&local_58);
      pdVar10 = ChVector<double>::operator[](&local_c8,(uint)lVar11);
      *pdVar10 = *pdVar10 + -1e-06;
    }
    lVar12 = 0;
    lVar11 = 3;
    while (bVar13 = lVar11 != 0, lVar11 = lVar11 + -1, bVar13) {
      pdVar10 = ChVector<double>::operator[](&local_e8,(uint)lVar12);
      *pdVar10 = *pdVar10 + 1e-06;
      (*local_1d0->_vptr_ChPlasticityCosserat[2])
                (local_1d0,&bstress_n,&bstress_m,&me_strain_n_new,&me_strain_m_new,
                 ((b_plastic_data.
                   super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                 .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>.
                 _M_head_impl,&local_c8,&local_e8,data);
      auVar4._8_8_ = bstress_n.m_data[1];
      auVar4._0_8_ = bstress_n.m_data[0];
      local_1e0[0] = &v;
      auVar8._8_8_ = astress_n.m_data[1];
      auVar8._0_8_ = astress_n.m_data[0];
      v.m_data._0_16_ = vsubpd_avx(auVar4,auVar8);
      v.m_data[2] = bstress_n.m_data[2] - astress_n.m_data[2];
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator*
                (&local_58,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
                 local_1e0,&invepsi);
      Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
                (&local_90,K,0,lVar12 + 3,3,1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_90,&local_58);
      auVar2._8_8_ = bstress_m.m_data[1];
      auVar2._0_8_ = bstress_m.m_data[0];
      local_1e0[0] = &v;
      auVar6._8_8_ = astress_m.m_data[1];
      auVar6._0_8_ = astress_m.m_data[0];
      v.m_data._0_16_ = vsubpd_avx(auVar2,auVar6);
      v.m_data[2] = bstress_m.m_data[2] - astress_m.m_data[2];
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator*
                (&local_58,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
                 local_1e0,&invepsi);
      Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
                (&local_90,K,3,lVar12 + 3,3,1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_90,&local_58);
      pdVar10 = ChVector<double>::operator[](&local_e8,(uint)lVar12);
      lVar12 = lVar12 + 1;
      *pdVar10 = *pdVar10 + -1e-06;
    }
  }
  std::
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ::~vector(&b_plastic_data);
  std::
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  ::~vector(&a_plastic_data);
  return;
}

Assistant:

void ChPlasticityCosserat::ComputeStiffnessMatrixElastoplastic(ChMatrixNM<double, 6, 6>& K,
                                                               const ChVector<>& strain_n,
                                                               const ChVector<>& strain_m,
                                                               const ChBeamMaterialInternalData& data) {
    ChVector<> astress_n;
    ChVector<> astress_m;
    ChVector<> me_strain_n_new;  // needed only as placeholder
    ChVector<> me_strain_m_new;  // needed only as placeholder

    std::vector<std::unique_ptr<ChBeamMaterialInternalData>> a_plastic_data;
    this->CreatePlasticityData(1, a_plastic_data);
    std::vector<std::unique_ptr<ChBeamMaterialInternalData>> b_plastic_data;
    this->CreatePlasticityData(1, b_plastic_data);

    bool in_plastic = ComputeStressWithReturnMapping(astress_n, astress_m, me_strain_n_new, me_strain_m_new,
                                                     *a_plastic_data[0], strain_n, strain_m, data);

    if (!in_plastic) {
        // if no return mapping is needed at this strain state, just use elastic matrix:
        return this->section->GetElasticity()->ComputeStiffnessMatrix(K, strain_n, strain_m);
    } else {
        // if return mapping is needed at this strain state, compute the elastoplastic stiffness by brute force BDF
        double epsi = 1e-6;
        double invepsi = 1.0 / epsi;
        ChVector<> bstress_n;
        ChVector<> bstress_m;
        ChVector<> strain_n_inc = strain_n;
        ChVector<> strain_m_inc = strain_m;
        for (int i = 0; i < 3; ++i) {
            strain_n_inc[i] += epsi;
            this->ComputeStressWithReturnMapping(bstress_n, bstress_m, me_strain_n_new, me_strain_m_new,
                                                 *b_plastic_data[0], strain_n_inc, strain_m_inc, data);
            K.block(0, i, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
            K.block(3, i, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
            strain_n_inc[i] -= epsi;
        }
        for (int i = 0; i < 3; ++i) {
            strain_m_inc[i] += epsi;
            this->ComputeStressWithReturnMapping(bstress_n, bstress_m, me_strain_n_new, me_strain_m_new,
                                                 *b_plastic_data[0], strain_n_inc, strain_m_inc, data);
            K.block(0, i + 3, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
            K.block(3, i + 3, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
            strain_m_inc[i] -= epsi;
        }
    }
}